

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::BuildsystemFileScope::~BuildsystemFileScope(BuildsystemFileScope *this)

{
  cmGlobalGenerator *pcVar1;
  cmake *pcVar2;
  cmState *pcVar3;
  cmLinkedTree<cmState::SnapshotDataType> *pcVar4;
  
  PopFunctionBlockerBarrier(this->Makefile,this->ReportError);
  PopSnapshot(this->Makefile,this->ReportError);
  cmFileLockPool::PopFileScope(&this->GG->FileLockPool);
  pcVar1 = this->GG;
  pcVar1->CurrentMakefile = this->CurrentMakefile;
  pcVar2 = pcVar1->CMakeInstance;
  pcVar3 = (this->Snapshot).State;
  pcVar4 = (this->Snapshot).Position.Tree;
  (pcVar2->CurrentSnapshot).Position.Position = (this->Snapshot).Position.Position;
  (pcVar2->CurrentSnapshot).State = pcVar3;
  (pcVar2->CurrentSnapshot).Position.Tree = pcVar4;
  return;
}

Assistant:

~BuildsystemFileScope()
  {
    this->Makefile->PopFunctionBlockerBarrier(this->ReportError);
    this->Makefile->PopSnapshot(this->ReportError);
#if defined(CMAKE_BUILD_WITH_CMAKE)
    this->GG->GetFileLockPool().PopFileScope();
#endif
    this->GG->SetCurrentMakefile(this->CurrentMakefile);
    this->GG->GetCMakeInstance()->SetCurrentSnapshot(this->Snapshot);
  }